

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O1

void check_analyze(string *str,bool has8bit,bool utf8,bool utf16)

{
  ostream *poVar1;
  bool is_utf16;
  bool is_valid_utf8;
  bool has_8bit_chars;
  bool local_2b;
  bool local_2a;
  bool local_29;
  
  local_29 = false;
  local_2a = false;
  local_2b = false;
  QUtil::analyze_encoding(str,&local_29,&local_2a,&local_2b);
  if (((local_29 != has8bit) || (local_2a != utf8)) || (local_2b != utf16)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"analysis failed: ",0x11);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(str->_M_dataplus)._M_p,str->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": 8bit: ",8);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", utf8: ",8);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", utf16: ",9);
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void
check_analyze(std::string const& str, bool has8bit, bool utf8, bool utf16)
{
    bool has_8bit_chars = false;
    bool is_valid_utf8 = false;
    bool is_utf16 = false;
    QUtil::analyze_encoding(str, has_8bit_chars, is_valid_utf8, is_utf16);
    if (!((has_8bit_chars == has8bit) && (is_valid_utf8 == utf8) && (is_utf16 == utf16))) {
        std::cout << "analysis failed: " << str << ": 8bit: " << has_8bit_chars
                  << ", utf8: " << is_valid_utf8 << ", utf16: " << is_utf16 << std::endl;
    }
}